

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

CMimeHeader_T * cmime_message_get_header(CMimeMessage_T *message,char *header)

{
  CMimeHeader_T *pCVar1;
  int iVar2;
  CMimeList_T *pCVar3;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x22e,"CMimeHeader_T *cmime_message_get_header(CMimeMessage_T *, const char *)");
  }
  if (header != (char *)0x0) {
    pCVar3 = message->headers;
    do {
      pCVar3 = (CMimeList_T *)pCVar3->head;
      if (pCVar3 == (CMimeList_T *)0x0) {
        return (CMimeHeader_T *)0x0;
      }
      pCVar1 = *(CMimeHeader_T **)pCVar3;
      iVar2 = strcasecmp(pCVar1->name,header);
    } while (iVar2 != 0);
    return pCVar1;
  }
  __assert_fail("header",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x22f,"CMimeHeader_T *cmime_message_get_header(CMimeMessage_T *, const char *)");
}

Assistant:

CMimeHeader_T *cmime_message_get_header(CMimeMessage_T *message, const char *header) {
    CMimeHeader_T *h = NULL;
    CMimeListElem_T *e;
    
    assert(message);
    assert(header);
    
    e = cmime_list_head(message->headers);
    while(e != NULL) {
        h = (CMimeHeader_T *)cmime_list_data(e);
        if (strcasecmp(cmime_header_get_name(h),header)==0) {
            return(h);
        }
        e = e->next;
    }
    
    return(NULL);
}